

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

uint32_t __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint uVar1;
  uint32_t uVar2;
  long lVar3;
  FieldDescriptor *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  lVar3 = *(long *)(field + 0x28);
  if ((lVar3 != 0 && ((byte)field[1] & 0x10) != 0) &&
     ((*(int *)(lVar3 + 4) != 1 || ((*(byte *)(*(long *)(lVar3 + 0x20) + 1) & 2) == 0)))) {
    if (((byte)field[1] & 0x10) == 0) {
      lVar3 = 0;
    }
    uVar1 = this->offsets_
            [(long)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x30)) >> 3) *
                   -0x33333333) + (long)*(int *)(*(long *)(field + 0x20) + 4)];
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_18 = FieldDescriptor::TypeOnceInit;
      local_20 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),&local_18,&local_20);
    }
    if (((byte)field[2] < 0xd) && ((0x1a00U >> ((byte)field[2] & 0x1f) & 1) != 0)) {
      uVar2 = uVar1 & 0x7ffffffe;
    }
    else {
      uVar2 = uVar1 & 0x7fffffff;
    }
    return uVar2;
  }
  uVar2 = GetFieldOffsetNonOneof(this,field);
  return uVar2;
}

Assistant:

uint32_t GetFieldOffset(const FieldDescriptor* field) const {
    if (InRealOneof(field)) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count() +
                              field->containing_oneof()->index());
      return OffsetValue(offsets_[offset], field->type());
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }